

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O1

GainedCell __thiscall GainBuckets::getMaxGainedCell(GainBuckets *this)

{
  Bucket *pBVar1;
  GainedCell GVar2;
  
  pBVar1 = operator[][abi_cxx11_(this,this->best_gain_);
  GVar2.second = this->best_gain_;
  GVar2.first = *(uint *)&(pBVar1->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl._M_node.super__List_node_base._M_next[1]._M_next;
  return GVar2;
}

Assistant:

GainBuckets::GainedCell GainBuckets::getMaxGainedCell() const {
  assert(best_gain_ != INT_MIN);
  return GainedCell{(*this)[best_gain_].front(), best_gain_};
}